

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::UpdateEdgeIntoAEL(Clipper *this,TEdge **e)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  clipperException *this_00;
  TEdge *AelNext;
  TEdge *AelPrev;
  TEdge **e_local;
  Clipper *this_local;
  
  if ((*e)->nextInLML == (TEdge *)0x0) {
    this_00 = (clipperException *)__cxa_allocate_exception(0x28);
    clipperException::clipperException(this_00,"UpdateEdgeIntoAEL: invalid call");
    __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
  }
  pTVar1 = (*e)->prevInAEL;
  pTVar2 = (*e)->nextInAEL;
  (*e)->nextInLML->outIdx = (*e)->outIdx;
  if (pTVar1 == (TEdge *)0x0) {
    this->m_ActiveEdges = (*e)->nextInLML;
  }
  else {
    pTVar1->nextInAEL = (*e)->nextInLML;
  }
  if (pTVar2 != (TEdge *)0x0) {
    pTVar2->prevInAEL = (*e)->nextInLML;
  }
  (*e)->nextInLML->side = (*e)->side;
  (*e)->nextInLML->windDelta = (*e)->windDelta;
  (*e)->nextInLML->windCnt = (*e)->windCnt;
  (*e)->nextInLML->windCnt2 = (*e)->windCnt2;
  *e = (*e)->nextInLML;
  (*e)->prevInAEL = pTVar1;
  (*e)->nextInAEL = pTVar2;
  if (((*e)->dx - -1e+40 <= -1e-20) || (1e-20 <= (*e)->dx - -1e+40)) {
    InsertScanbeam(this,(*e)->ytop);
  }
  return;
}

Assistant:

void Clipper::UpdateEdgeIntoAEL(TEdge *&e)
{
  if( !e->nextInLML ) throw
    clipperException("UpdateEdgeIntoAEL: invalid call");
  TEdge* AelPrev = e->prevInAEL;
  TEdge* AelNext = e->nextInAEL;
  e->nextInLML->outIdx = e->outIdx;
  if( AelPrev ) AelPrev->nextInAEL = e->nextInLML;
  else m_ActiveEdges = e->nextInLML;
  if( AelNext ) AelNext->prevInAEL = e->nextInLML;
  e->nextInLML->side = e->side;
  e->nextInLML->windDelta = e->windDelta;
  e->nextInLML->windCnt = e->windCnt;
  e->nextInLML->windCnt2 = e->windCnt2;
  e = e->nextInLML;
  e->prevInAEL = AelPrev;
  e->nextInAEL = AelNext;
  if( !NEAR_EQUAL(e->dx, HORIZONTAL) ) InsertScanbeam( e->ytop );
}